

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O0

void Abc_NodeShowCut(Abc_Obj_t *pNode,int nNodeSizeMax,int nConeSizeMax)

{
  int iVar1;
  Abc_ManCut_t *p_00;
  Vec_Ptr_t *vLeaves;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *vVisited;
  void *Entry;
  char *pName;
  int local_11c;
  int i;
  Abc_Obj_t *pTemp;
  Vec_Ptr_t *vNodesTfo;
  Vec_Ptr_t *vInside;
  Vec_Ptr_t *vCutLarge;
  Vec_Ptr_t *vCutSmall;
  Abc_ManCut_t *p;
  char FileNameDot [200];
  FILE *pFile;
  int nConeSizeMax_local;
  int nNodeSizeMax_local;
  Abc_Obj_t *pNode_local;
  
  _nConeSizeMax_local = pNode;
  iVar1 = Abc_NtkIsStrash(pNode->pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcShow.c"
                  ,0xd7,"void Abc_NodeShowCut(Abc_Obj_t *, int, int)");
  }
  p_00 = Abc_NtkManCutStart(nNodeSizeMax,nConeSizeMax,2,1000000000);
  vLeaves = Abc_NodeFindCut(p_00,_nConeSizeMax_local,1);
  pVVar2 = Abc_NtkManCutReadCutLarge(p_00);
  vVisited = Abc_NtkManCutReadVisited(p_00);
  Abc_NodeConeCollect((Abc_Obj_t **)&nConeSizeMax_local,1,pVVar2,vVisited,1);
  pVVar2 = Abc_NodeCollectTfoCands(p_00,_nConeSizeMax_local,vLeaves,1000000000);
  for (local_11c = 0; iVar1 = Vec_PtrSize(pVVar2), local_11c < iVar1; local_11c = local_11c + 1) {
    Entry = Vec_PtrEntry(pVVar2,local_11c);
    Vec_PtrPushUnique(vVisited,Entry);
  }
  pName = Abc_ObjName(_nConeSizeMax_local);
  Abc_ShowGetFileName(pName,(char *)&p);
  FileNameDot._192_8_ = fopen((char *)&p,"w");
  if ((FILE *)FileNameDot._192_8_ == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",&p);
  }
  else {
    Vec_PtrPush(vLeaves,_nConeSizeMax_local);
    Io_WriteDotNtk(_nConeSizeMax_local->pNtk,vVisited,vLeaves,(char *)&p,0,0);
    Abc_NtkManCutStop(p_00);
    Abc_ShowFile((char *)&p);
  }
  return;
}

Assistant:

void Abc_NodeShowCut( Abc_Obj_t * pNode, int nNodeSizeMax, int nConeSizeMax )
{
    FILE * pFile;
    char FileNameDot[200];
    Abc_ManCut_t * p;
    Vec_Ptr_t * vCutSmall;
    Vec_Ptr_t * vCutLarge;
    Vec_Ptr_t * vInside;
    Vec_Ptr_t * vNodesTfo;
    Abc_Obj_t * pTemp;
    int i;

    assert( Abc_NtkIsStrash(pNode->pNtk) );

    // start the cut computation manager
    p = Abc_NtkManCutStart( nNodeSizeMax, nConeSizeMax, 2, ABC_INFINITY );
    // get the recovergence driven cut
    vCutSmall = Abc_NodeFindCut( p, pNode, 1 );
    // get the containing cut
    vCutLarge = Abc_NtkManCutReadCutLarge( p );
    // get the array for the inside nodes
    vInside = Abc_NtkManCutReadVisited( p );
    // get the inside nodes of the containing cone
    Abc_NodeConeCollect( &pNode, 1, vCutLarge, vInside, 1 );

    // add the nodes in the TFO 
    vNodesTfo = Abc_NodeCollectTfoCands( p, pNode, vCutSmall, ABC_INFINITY );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodesTfo, pTemp, i )
        Vec_PtrPushUnique( vInside, pTemp );

    // create the file name
    Abc_ShowGetFileName( Abc_ObjName(pNode), FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    // add the root node to the cone (for visualization)
    Vec_PtrPush( vCutSmall, pNode );
    // write the DOT file
    Io_WriteDotNtk( pNode->pNtk, vInside, vCutSmall, FileNameDot, 0, 0 );
    // stop the cut computation manager
    Abc_NtkManCutStop( p );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
}